

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::toCurrencyString
          (QString *__return_storage_ptr__,QLocale *this,double value,QString *symbol,int precision)

{
  ushort uVar1;
  long lVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QLocaleData *pQVar6;
  QSystemLocale *pQVar7;
  quint16 *pqVar8;
  byte bVar9;
  long in_FS_OFFSET;
  QAnyStringView pattern;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  CurrencyToStringArgument arg;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = ((this->d).d.ptr)->m_data;
  if (pQVar6 == &systemLocaleData) {
    arg.symbol.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    arg.symbol.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    arg.symbol.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    arg.value.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    arg.value.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    arg.value.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    arg.value.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)&local_98,value);
    QSystemLocale::CurrencyToStringArgument::CurrencyToStringArgument
              (&arg,(QVariant *)&local_98,symbol);
    ::QVariant::~QVariant((QVariant *)&local_98);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = systemLocale();
    ::QVariant::fromValue<QSystemLocale::CurrencyToStringArgument>
              ((enable_if_t<std::is_copy_constructible_v<QSystemLocale::CurrencyToStringArgument>_&&_std::is_destructible_v<QSystemLocale::CurrencyToStringArgument>,_QVariant>
                *)&local_b8,&arg);
    (*pQVar7->_vptr_QSystemLocale[2])(&local_98,pQVar7,0x20,&local_b8);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_b8);
    if ((__return_storage_ptr__->d).size != 0) {
      QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(&arg);
      goto LAB_002e19ae;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
    QSystemLocale::CurrencyToStringArgument::~CurrencyToStringArgument(&arg);
    pQVar6 = ((this->d).d.ptr)->m_data;
  }
  if ((0.0 <= value) || (bVar9 = pQVar6->m_currencyFormatNegative_size, bVar9 == 0)) {
    pqVar8 = &pQVar6->m_currencyFormat_idx;
    bVar9 = pQVar6->m_currencyFormat_size;
  }
  else {
    pqVar8 = &pQVar6->m_currencyFormatNegative_idx;
    value = -value;
  }
  uVar1 = *pqVar8;
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (precision == -1) {
    precision = *(uint *)&pQVar6->field_0x78 & 3;
  }
  toString((QString *)&local_d8,this,value,'f',precision);
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar3 = (symbol->d).ptr;
  if (pcVar3 == (char16_t *)0x0) {
    currencySymbol((QString *)&local_f8,this,CurrencySymbol);
  }
  else {
    local_f8.d = (symbol->d).d;
    local_f8.size = (symbol->d).size;
    local_f8.ptr = pcVar3;
    if ((PrivateShared *)local_f8.d != (PrivateShared *)0x0) {
      LOCK();
      (((QArrayData *)&((PrivateShared *)local_f8.d)->ref)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((PrivateShared *)local_f8.d)->ref)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if ((undefined1 *)local_f8.size == (undefined1 *)0x0) {
    currencySymbol((QString *)&arg,this,CurrencyIsoCode);
    qVar5 = local_f8.size;
    pcVar3 = local_f8.ptr;
    pDVar4 = local_f8.d;
    local_f8.d = (Data *)arg.value.d.data.shared;
    local_f8.ptr = (char16_t *)arg.value.d.data._8_8_;
    arg.value.d.data.shared = (PrivateShared *)pDVar4;
    arg.value.d.data._8_8_ = pcVar3;
    local_f8.size = arg.value.d.data._16_8_;
    arg.value.d.data._16_8_ = qVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&arg);
  }
  pattern.field_0.m_data = (void *)((ulong)bVar9 | 0x8000000000000000);
  local_98._16_8_ = local_d8.size | 0x8000000000000000;
  arg.value.d.data.shared = (PrivateShared *)&local_98;
  local_98.data[0] = '\x01';
  local_98._8_8_ = local_d8.ptr;
  local_b8._16_8_ = local_f8.size | 0x8000000000000000;
  arg.value.d.data._8_8_ = &local_b8;
  local_b8.data[0] = '\x01';
  local_b8._8_8_ = local_f8.ptr;
  arg.value.d.data._16_8_ = 0;
  pattern.m_size = 2;
  QtPrivate::argToQString
            (__return_storage_ptr__,
             (QtPrivate *)
             (
             L"%1%2%1\xa0%2(%2%1)%2\xa0%1(%1\xa0%2)\x200f%1\xa0%2\x061c%1%2(\x061c%1%2)(%1%2)(%1)\xa0%2(%2\xa0%1)%2-%1%1\x202f%2\x200f%1\xa0\x200f%2\x200f\x200e-%1\xa0\x200f%2%2\xa0-%1%2−%1%2-\xa0%1\x200e%2\xa0%1\x200e(%2\xa0%1)"
             + uVar1),pattern,(size_t)&arg,(ArgBase **)arg.value.d.data.shared);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
LAB_002e19ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::toCurrencyString(double value, const QString &symbol, int precision) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QLocaleData::DataRange range = d->m_data->currencyFormatNegative();
    if (!range.size || value >= 0)
        range = d->m_data->currencyFormat();
    else
        value = -value;
    QString str = toString(value, 'f', precision == -1 ? d->m_data->m_currency_digits : precision);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return range.viewData(currency_format_data).arg(str, sym);
}